

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<short>(uint length,short value1,short value2,bool allowTrash)

{
  short *psVar1;
  ulong uVar2;
  int i;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 *puVar5;
  short sVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<short> pv1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr<short> pv2;
  shared_ptr<short> presult;
  
  presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(in_register_00000032,value1);
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)length;
  iVar3 = posix_memalign(&local_60,0x10,(long)(int)length * 2);
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar3 == 0) {
    local_78 = local_60;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_78,sse::common::free<short>);
  iVar3 = posix_memalign(&pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi,0x10,(long)(int)length * 2);
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar3 == 0) {
    local_60 = pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,local_60,sse::common::free<short>);
  iVar3 = posix_memalign(&local_80,0x10,(long)(int)(length + 1) * 2);
  if (iVar3 != 0) {
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_80,
             sse::common::free<short>);
  *(undefined2 *)
   ((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + (long)p_Var8 * 2) = 0x7f;
  sVar6 = (short)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) = sVar6;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2) = value2;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((*(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) != sVar6) ||
         (*(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2) != value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x1a;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        *psVar1 = *psVar1 + *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (local_60 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        *psVar1 = *psVar1 + *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2) +
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2);
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
          (short)(value2 + sVar6)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x22;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        *psVar1 = *psVar1 - *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) -
           *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2);
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
          (short)(sVar6 - value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x2a;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) *
             *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (local_60 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) *
             *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2) *
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2);
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
          (short)(value2 * sVar6)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x32;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  iVar3 = (int)value2;
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) /
             *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) /
           *(short *)((long)&local_60->_vptr__Sp_counted_base + (long)p_Var4 * 2);
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8;
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) != sVar6 / value2) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x3a;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        *psVar1 = *psVar1 + value2;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) + value2;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
          (short)(value2 + sVar6)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x43;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        *psVar1 = *psVar1 - value2;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) - value2;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
          (short)(sVar6 - value2)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x4b;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
             value2 - *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
    if (length != 0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
            (short)(value2 - sVar6)) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
          *(undefined4 *)(puVar5 + 1) = 0x53;
          *(uint *)((long)puVar5 + 0xc) = length;
          __cxa_throw(puVar5,&Exception::typeinfo,0);
        }
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) *
             value2;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) * value2;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) !=
          (short)(value2 * sVar6)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 0x5b;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) /
             value2;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  else if (0 < (int)length) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var4 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2) / value2;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
  }
  if (length != 0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) != sVar6 / value2) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar5 + 1) = 99;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 1);
    } while (p_Var8 != p_Var4);
    uVar2 = (long)iVar3 % (long)(int)sVar6;
    uVar7 = (long)iVar3 / (long)(int)sVar6 & 0xffffffff;
    if (0 < (int)length) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        sVar6 = *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var4 * 2);
        uVar2 = (long)iVar3 % (long)(int)sVar6;
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) = value2 / sVar6;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
    if (length != 0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) != (short)uVar7) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x10,uVar7,uVar2 & 0xffffffff);
          *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
          *(undefined4 *)(puVar5 + 1) = 0x6b;
          *(uint *)((long)puVar5 + 0xc) = length;
          __cxa_throw(puVar5,&Exception::typeinfo,0);
        }
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var4->_vptr__Sp_counted_base + 1);
      } while (p_Var8 != p_Var4);
    }
  }
  if ((!allowTrash) &&
     (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var8 * 2) != 0x7f)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar5 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
    *(undefined4 *)(puVar5 + 1) = 0x70;
    *(uint *)((long)puVar5 + 0xc) = length;
    __cxa_throw(puVar5,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}